

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

ostream * molly::operator<<(ostream *os,DeviceState *state)

{
  DeviceState *state_local;
  ostream *os_local;
  
  switch(*state) {
  case LidClosed:
    std::operator<<(os,"LidClosed");
    break;
  case ButtonPressed:
    std::operator<<(os,"ButtonPressed");
    break;
  case LidOpen:
    std::operator<<(os,"LidOpen");
    break;
  case Unknown:
    std::operator<<(os,"Unknown");
    break;
  case Unavailable:
    std::operator<<(os,"Unavailable");
  }
  return os;
}

Assistant:

std::ostream& molly::operator<<(std::ostream& os, DeviceState const& state)
{
  switch (state)
  {
    case DeviceState::Unknown:       os << "Unknown";       break;
    case DeviceState::Unavailable:   os << "Unavailable";   break;
    case DeviceState::LidClosed:     os << "LidClosed";     break;
    case DeviceState::ButtonPressed: os << "ButtonPressed"; break;
    case DeviceState::LidOpen:       os << "LidOpen";       break;
  }
  return os;
}